

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmxmdp.hpp
# Opt level: O3

GMXPGRP * __thiscall GMXMDP::GMXPGRP::operator=(GMXPGRP *this,GMXPGRP *src)

{
  pointer pFVar1;
  FunctVV *rstfunct;
  pointer __args;
  
  this->gid = src->gid;
  std::__cxx11::string::_M_assign((string *)&this->gidstr);
  this->rstT = src->rstT;
  std::vector<double,_std::allocator<double>_>::operator=(&this->init,&src->init);
  std::vector<double,_std::allocator<double>_>::operator=(&this->initB,&src->initB);
  std::vector<double,_std::allocator<double>_>::operator=(&this->vec,&src->vec);
  this->k = src->k;
  this->kB = src->kB;
  this->r0 = src->r0;
  this->r0B = src->r0B;
  this->r1 = src->r1;
  this->r1B = src->r1B;
  this->k0 = src->k0;
  this->k0B = src->k0B;
  this->k1 = src->k1;
  this->k1B = src->k1B;
  this->nc0 = src->nc0;
  this->nc0B = src->nc0B;
  std::vector<double,_std::allocator<double>_>::operator=(&this->Lrst,&src->Lrst);
  std::
  vector<Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>,_std::allocator<Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>_>_>
  ::_M_erase_at_end(&this->rstfuncts,
                    (this->rstfuncts).
                    super__Vector_base<Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>,_std::allocator<Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pFVar1 = (src->rstfuncts).
           super__Vector_base<Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>,_std::allocator<Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__args = (src->rstfuncts).
                super__Vector_base<Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>,_std::allocator<Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>_>_>
                ._M_impl.super__Vector_impl_data._M_start; __args != pFVar1; __args = __args + 1) {
    std::
    vector<Functor<std::function<double(double_const&)>const,std::vector<double,std::allocator<double>>const,void_const>,std::allocator<Functor<std::function<double(double_const&)>const,std::vector<double,std::allocator<double>>const,void_const>>>
    ::
    emplace_back<Functor<std::function<double(double_const&)>const,std::vector<double,std::allocator<double>>const,void_const>const&>
              ((vector<Functor<std::function<double(double_const&)>const,std::vector<double,std::allocator<double>>const,void_const>,std::allocator<Functor<std::function<double(double_const&)>const,std::vector<double,std::allocator<double>>const,void_const>>>
                *)&this->rstfuncts,__args);
  }
  return this;
}

Assistant:

GMXPGRP& operator=(const GMXPGRP& src) {
    gid = src.gid;
    gidstr = src.gidstr;
    rstT = src.rstT;
    init = src.init;
    initB = src.initB;
    vec = src.vec;
    k = src.k;
    kB = src.kB;
    r0 = src.r0;
    r0B = src.r0B;
    r1 = src.r1;
    r1B = src.r1B;
    k0 = src.k0;
    k0B = src.k0B;
    k1 = src.k1;
    k1B = src.k1B;
    nc0 = src.nc0;
    nc0B = src.nc0B;
    Lrst = src.Lrst;

    rstfuncts.clear();
    for(const FunctVV& rstfunct: src.rstfuncts) {
      rstfuncts.emplace_back(rstfunct);
    }

    return *this;
  }